

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::activateFrameConstraint
          (InverseKinematics *this,string *frameName,Transform *newConstraintValue)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::activateFrameConstraint(const std::string& frameName, const Transform& newConstraintValue)
    {
#ifdef IDYNTREE_USES_IPOPT
        iDynTree::LinkIndex frameIndex = IK_PIMPL(m_pimpl)->m_dynamics.getFrameIndex(frameName);
        if (frameIndex < 0)
        {
            return false;
        }

        internal::kinematics::TransformMap::iterator it = IK_PIMPL(m_pimpl)->m_constraints.find(frameIndex);
        if (it == IK_PIMPL(m_pimpl)->m_constraints.end())
        {
            return false;
        }

        it->second.setActive(true);
        it->second.setPosition(newConstraintValue.getPosition());
        it->second.setRotation(newConstraintValue.getRotation());

        // The problem needs to be reinitialized
        IK_PIMPL(m_pimpl)->m_problemInitialized = false;

        return true;
#else
        return missingIpoptErrorReport();
#endif
    }